

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  TestNode *node;
  TestNode *pTVar3;
  ostream *poVar4;
  Texture2DMipmapCase *pTVar5;
  RenderContext *pRVar6;
  ContextInfo *pCVar7;
  char *pcVar8;
  Texture2DGenMipmapCase *this_00;
  TextureCubeMipmapCase *this_01;
  ulong extraout_RAX;
  TextureCubeGenMipmapCase *this_02;
  ulong uVar9;
  string local_588 [32];
  ostringstream local_568 [8];
  ostringstream name_2;
  int hint_1;
  int format_1;
  TestCaseGroup *genMipmapGroup_1;
  int minFilter_2;
  TestCaseGroup *coordTypeGroup_1;
  int coordType_1;
  int cubeMapSize;
  undefined1 local_3a0 [8];
  ostringstream name_1;
  int local_220;
  int hint;
  int size_1;
  int format;
  TestCaseGroup *genMipmapGroup;
  int minFilter_1;
  TestCaseGroup *biasGroup;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  ostringstream name;
  int size;
  int sizeEnd;
  int wrapMode;
  int minFilter;
  TestCaseGroup *coordTypeGroup;
  int coordType;
  TestCaseGroup *groupCube;
  TestCaseGroup *group2D;
  TextureMipmapTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  tcu::TestNode::addChild((TestNode *)this,node);
  for (coordTypeGroup._4_4_ = 0; coordTypeGroup._4_4_ < 3;
      coordTypeGroup._4_4_ = coordTypeGroup._4_4_ + 1) {
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[coordTypeGroup._4_4_].name,
               init::coordTypes[coordTypeGroup._4_4_].desc);
    tcu::TestNode::addChild(pTVar2,pTVar3);
    for (sizeEnd = 0; sizeEnd < 4; sizeEnd = sizeEnd + 1) {
      for (size = 0; size < 3; size = size + 1) {
        name._372_4_ = 1;
        if (init::coordTypes[coordTypeGroup._4_4_].type == COORDTYPE_BASIC) {
          name._372_4_ = 2;
        }
        for (name._368_4_ = 0; (int)name._368_4_ < (int)name._372_4_;
            name._368_4_ = name._368_4_ + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
          poVar4 = std::operator<<((ostream *)local_1d8,init::minFilterModes[sizeEnd].name);
          poVar4 = std::operator<<(poVar4,"_");
          std::operator<<(poVar4,init::wrapModes[size].name);
          if (init::tex2DSizes[(int)name._368_4_].name != (char *)0x0) {
            poVar4 = std::operator<<((ostream *)local_1d8,"_");
            std::operator<<(poVar4,init::tex2DSizes[(int)name._368_4_].name);
          }
          pTVar5 = (Texture2DMipmapCase *)operator_new(0x100);
          pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
          pCVar7 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar5,pTVar1,pRVar6,pCVar7,pcVar8,"",
                     init::coordTypes[coordTypeGroup._4_4_].type,init::minFilterModes[sizeEnd].mode,
                     init::wrapModes[size].mode,init::wrapModes[size].mode,0x1908,0x1401,
                     init::tex2DSizes[(int)name._368_4_].width,
                     init::tex2DSizes[(int)name._368_4_].height);
          tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
          std::__cxx11::string::~string(local_1f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        }
      }
    }
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
             "User-supplied bias value");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (genMipmapGroup._4_4_ = 0; genMipmapGroup._4_4_ < 4;
      genMipmapGroup._4_4_ = genMipmapGroup._4_4_ + 1) {
    pTVar5 = (Texture2DMipmapCase *)operator_new(0x100);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar7 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    Texture2DMipmapCase::Texture2DMipmapCase
              (pTVar5,pTVar1,pRVar6,pCVar7,init::minFilterModes[genMipmapGroup._4_4_].name,"",
               COORDTYPE_BASIC_BIAS,init::minFilterModes[genMipmapGroup._4_4_].mode,0x2901,0x2901,
               0x1908,0x1401,0x40,0x40);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pTVar5);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"generate",
             "Mipmap generation tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (hint = 0; hint < 8; hint = hint + 1) {
    for (local_220 = 0; local_220 < 2; local_220 = local_220 + 1) {
      for (name_1._372_4_ = 0; (int)name_1._372_4_ < 2; name_1._372_4_ = name_1._372_4_ + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
        std::operator<<((ostream *)local_3a0,init::formats[hint].name);
        if (init::tex2DSizes[local_220].name != (char *)0x0) {
          poVar4 = std::operator<<((ostream *)local_3a0,"_");
          std::operator<<(poVar4,init::tex2DSizes[local_220].name);
        }
        poVar4 = std::operator<<((ostream *)local_3a0,"_");
        std::operator<<(poVar4,init::genHints[(int)name_1._372_4_].name);
        this_00 = (Texture2DGenMipmapCase *)operator_new(0xf0);
        pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        Texture2DGenMipmapCase::Texture2DGenMipmapCase
                  (this_00,pTVar1,pRVar6,pcVar8,"",init::formats[hint].format,
                   init::formats[hint].dataType,init::genHints[(int)name_1._372_4_].hint,
                   init::tex2DSizes[local_220].width,init::tex2DSizes[local_220].height);
        tcu::TestNode::addChild(pTVar3,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)&cubeMapSize);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
      }
    }
  }
  for (coordTypeGroup_1._4_4_ = 0; coordTypeGroup_1._4_4_ < 3;
      coordTypeGroup_1._4_4_ = coordTypeGroup_1._4_4_ + 1) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::cubeCoordTypes[coordTypeGroup_1._4_4_].name,
               init::cubeCoordTypes[coordTypeGroup_1._4_4_].desc);
    tcu::TestNode::addChild(node,pTVar2);
    for (genMipmapGroup_1._4_4_ = 0; genMipmapGroup_1._4_4_ < 4;
        genMipmapGroup_1._4_4_ = genMipmapGroup_1._4_4_ + 1) {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      pCVar7 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,pTVar1,pRVar6,pCVar7,init::minFilterModes[genMipmapGroup_1._4_4_].name,"",
                 init::cubeCoordTypes[coordTypeGroup_1._4_4_].type,
                 init::minFilterModes[genMipmapGroup_1._4_4_].mode,0x812f,0x812f,0x1908,0x1401,0x40)
      ;
      tcu::TestNode::addChild(pTVar2,(TestNode *)this_01);
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"generate",
             "Mipmap generation tests");
  tcu::TestNode::addChild(node,pTVar2);
  name_2._372_4_ = 0;
  uVar9 = extraout_RAX;
  while ((int)name_2._372_4_ < 8) {
    for (name_2._368_4_ = 0; (int)name_2._368_4_ < 2; name_2._368_4_ = name_2._368_4_ + 1) {
      std::__cxx11::ostringstream::ostringstream(local_568);
      poVar4 = std::operator<<((ostream *)local_568,init::formats[(int)name_2._372_4_].name);
      poVar4 = std::operator<<(poVar4,"_");
      std::operator<<(poVar4,init::genHints[(int)name_2._368_4_].name);
      this_02 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar6 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                (this_02,pTVar1,pRVar6,pcVar8,"",init::formats[(int)name_2._372_4_].format,
                 init::formats[(int)name_2._372_4_].dataType,
                 init::genHints[(int)name_2._368_4_].hint,0x40);
      tcu::TestNode::addChild(pTVar2,(TestNode *)this_02);
      std::__cxx11::string::~string(local_588);
      std::__cxx11::ostringstream::~ostringstream(local_568);
    }
    name_2._372_4_ = name_2._372_4_ + 1;
    uVar9 = (ulong)(uint)name_2._372_4_;
  }
  return (int)uVar9;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "non_square",	32, 64 }
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}
}